

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::text_output_escaped
               (xml_buffered_writer *writer,char_t *s,chartypex_t type,uint flags)

{
  byte bVar1;
  size_t __n;
  byte *pbVar2;
  void *__buf;
  uint ch;
  char_t ss;
  char_t *prev;
  uint flags_local;
  chartypex_t type_local;
  char_t *s_local;
  xml_buffered_writer *writer_local;
  
  _flags_local = (byte *)s;
  do {
    pbVar2 = _flags_local;
    if (*_flags_local == 0) {
      return;
    }
    while (__n = (size_t)*_flags_local,
          ((byte)(anonymous_namespace)::chartypex_table[__n] & type) == 0) {
      __n = (size_t)_flags_local[1];
      if (((byte)(anonymous_namespace)::chartypex_table[__n] & type) != 0) {
        _flags_local = _flags_local + 1;
        break;
      }
      __n = (size_t)_flags_local[2];
      if (((byte)(anonymous_namespace)::chartypex_table[__n] & type) != 0) {
        _flags_local = _flags_local + 2;
        break;
      }
      __n = (size_t)_flags_local[3];
      if (((byte)(anonymous_namespace)::chartypex_table[__n] & type) != 0) {
        _flags_local = _flags_local + 3;
        break;
      }
      _flags_local = _flags_local + 4;
    }
    xml_buffered_writer::write_buffer(writer,(char_t *)pbVar2,(long)_flags_local - (long)pbVar2);
    bVar1 = *_flags_local;
    if (bVar1 != 0) {
      if (bVar1 == 0x22) {
        if ((flags & 0x200) == 0) {
          xml_buffered_writer::write(writer,0x26,(void *)0x71,0x75);
        }
        else {
          xml_buffered_writer::write(writer,0x22,__buf,__n);
        }
        _flags_local = _flags_local + 1;
      }
      else if (bVar1 == 0x26) {
        xml_buffered_writer::write(writer,0x26,(void *)0x61,0x6d);
        _flags_local = _flags_local + 1;
      }
      else if (bVar1 == 0x27) {
        if ((flags & 0x200) == 0) {
          xml_buffered_writer::write(writer,0x27,__buf,__n);
        }
        else {
          xml_buffered_writer::write(writer,0x26,(void *)0x61,0x70);
        }
        _flags_local = _flags_local + 1;
      }
      else if (bVar1 == 0x3c) {
        xml_buffered_writer::write(writer,0x26,(void *)0x6c,0x74);
        _flags_local = _flags_local + 1;
      }
      else if (bVar1 == 0x3e) {
        xml_buffered_writer::write(writer,0x26,(void *)0x67,0x74);
        _flags_local = _flags_local + 1;
      }
      else {
        pbVar2 = _flags_local + 1;
        bVar1 = *_flags_local;
        if (0x1f < (uint)(int)(char)bVar1) {
          __assert_fail("ch < 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                        ,0xf6d,
                        "void pugi::impl::(anonymous namespace)::text_output_escaped(xml_buffered_writer &, const char_t *, chartypex_t, unsigned int)"
                       );
        }
        _flags_local = pbVar2;
        if ((flags & 0x100) == 0) {
          xml_buffered_writer::write
                    (writer,0x26,(void *)0x23,
                     (ulong)(uint)(int)(char)((char)((ulong)(uint)(int)(char)bVar1 / 10) + '0'));
        }
      }
    }
  } while( true );
}

Assistant:

PUGI__FN void text_output_escaped(xml_buffered_writer& writer, const char_t* s, chartypex_t type, unsigned int flags)
	{
		while (*s)
		{
			const char_t* prev = s;

			// While *s is a usual symbol
			PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPEX(ss, type));

			writer.write_buffer(prev, static_cast<size_t>(s - prev));

			switch (*s)
			{
				case 0: break;
				case '&':
					writer.write('&', 'a', 'm', 'p', ';');
					++s;
					break;
				case '<':
					writer.write('&', 'l', 't', ';');
					++s;
					break;
				case '>':
					writer.write('&', 'g', 't', ';');
					++s;
					break;
				case '"':
					if (flags & format_attribute_single_quote)
						writer.write('"');
					else
						writer.write('&', 'q', 'u', 'o', 't', ';');
					++s;
					break;
				case '\'':
					if (flags & format_attribute_single_quote)
						writer.write('&', 'a', 'p', 'o', 's', ';');
					else
						writer.write('\'');
					++s;
					break;
				default: // s is not a usual symbol
				{
					unsigned int ch = static_cast<unsigned int>(*s++);
					assert(ch < 32);

					if (!(flags & format_skip_control_chars))
						writer.write('&', '#', static_cast<char_t>((ch / 10) + '0'), static_cast<char_t>((ch % 10) + '0'), ';');
				}
			}
		}
	}